

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O2

shared_ptr<helics::BrokerFactory::MasterBrokerBuilder> *
helics::BrokerFactory::MasterBrokerBuilder::instance(void)

{
  int iVar1;
  MasterBrokerBuilder *__p;
  
  if (instance()::iptr == '\0') {
    iVar1 = __cxa_guard_acquire(&instance()::iptr);
    if (iVar1 != 0) {
      __p = (MasterBrokerBuilder *)operator_new(0x18);
      (__p->builders).
      super__Vector_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::BrokerFactory::BrokerBuilder>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::BrokerFactory::BrokerBuilder>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__p->builders).
      super__Vector_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::BrokerFactory::BrokerBuilder>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::BrokerFactory::BrokerBuilder>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__p->builders).
      super__Vector_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::BrokerFactory::BrokerBuilder>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::BrokerFactory::BrokerBuilder>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__shared_ptr<helics::BrokerFactory::MasterBrokerBuilder,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<helics::BrokerFactory::MasterBrokerBuilder,void>
                ((__shared_ptr<helics::BrokerFactory::MasterBrokerBuilder,(__gnu_cxx::_Lock_policy)2>
                  *)&instance::iptr,__p);
      __cxa_atexit(std::
                   __shared_ptr<helics::BrokerFactory::MasterBrokerBuilder,_(__gnu_cxx::_Lock_policy)2>
                   ::~__shared_ptr,&instance::iptr,&__dso_handle);
      __cxa_guard_release(&instance()::iptr);
    }
  }
  return &instance::iptr;
}

Assistant:

static const std::shared_ptr<MasterBrokerBuilder>& instance()
    {
        static const std::shared_ptr<MasterBrokerBuilder> iptr(new MasterBrokerBuilder());
        return iptr;
    }